

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v5::report_system_error(int error_code,string_view message)

{
  size_t in_R8;
  string_view message_00;
  memory_buffer full_message;
  
  full_message.super_basic_buffer<char>.size_ = 0;
  full_message.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_0014eae0;
  full_message.super_basic_buffer<char>.capacity_ = 500;
  message_00.size_ = in_R8;
  message_00.data_ = (char *)message.size_;
  full_message.super_basic_buffer<char>.ptr_ = full_message.store_;
  format_system_error((v5 *)&full_message,(buffer *)(ulong)(uint)error_code,(int)message.data_,
                      message_00);
  fwrite(full_message.super_basic_buffer<char>.ptr_,full_message.super_basic_buffer<char>.size_,1,
         _stderr);
  fputc(10,_stderr);
  full_message.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_0014eae0;
  if (full_message.super_basic_buffer<char>.ptr_ != full_message.store_) {
    operator_delete(full_message.super_basic_buffer<char>.ptr_);
  }
  return;
}

Assistant:

FMT_FUNC void report_system_error(
    int error_code, fmt::string_view message) FMT_NOEXCEPT {
  report_error(format_system_error, error_code, message);
}